

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O2

Value * __thiscall flow::IRBuilder::createNCmpGT(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  long lVar1;
  long lVar2;
  BinaryInstr<(flow::BinaryOperator)16,_(flow::LiteralType)1> *pBVar3;
  long lVar4;
  Value *rhs_local;
  Value *lhs_local;
  string local_40;
  
  rhs_local = rhs;
  lhs_local = lhs;
  if (lhs->type_ != rhs->type_) {
    __assert_fail("lhs->type() == rhs->type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x171,
                  "Value *flow::IRBuilder::createNCmpGT(Value *, Value *, const std::string &)");
  }
  if (lhs->type_ == Number) {
    lVar1 = __dynamic_cast(lhs,&Value::typeinfo,&ConstantValue<long,(flow::LiteralType)2>::typeinfo,
                           0);
    if ((lVar1 != 0) &&
       (lVar2 = __dynamic_cast(rhs,&Value::typeinfo,
                               &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0), lVar2 != 0))
    {
      lVar4 = 0x68;
      if (*(long *)(lVar2 + 0x48) < *(long *)(lVar1 + 0x48)) {
        lVar4 = 0x18;
      }
      return (Value *)((long)&(this->program_->modules_).
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar4);
    }
    makeName(&local_40,this,name);
    pBVar3 = insert<flow::BinaryInstr<(flow::BinaryOperator)16,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                       (this,&lhs_local,&rhs_local,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    return (Value *)pBVar3;
  }
  __assert_fail("lhs->type() == LiteralType::Number",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x172,"Value *flow::IRBuilder::createNCmpGT(Value *, Value *, const std::string &)"
               );
}

Assistant:

Value* IRBuilder::createNCmpGT(Value* lhs, Value* rhs,
                               const std::string& name) {
  assert(lhs->type() == rhs->type());
  assert(lhs->type() == LiteralType::Number);

  if (auto a = dynamic_cast<ConstantInt*>(lhs))
    if (auto b = dynamic_cast<ConstantInt*>(rhs))
      return getBoolean(a->get() > b->get());

  return insert<ICmpGTInstr>(lhs, rhs, makeName(name));
}